

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::FillBuffer::submit(FillBuffer *this,SubmitContext *context)

{
  Context *this_00;
  DeviceInterface *pDVar1;
  VkCommandBuffer pVVar2;
  VkBuffer VVar3;
  VkDeviceSize VVar4;
  undefined8 uVar5;
  VkDeviceSize sizeMask;
  VkBuffer buffer;
  VkCommandBuffer cmd;
  DeviceInterface *vkd;
  SubmitContext *context_local;
  FillBuffer *this_local;
  
  this_00 = SubmitContext::getContext(context);
  pDVar1 = Context::getDeviceInterface(this_00);
  pVVar2 = SubmitContext::getCommandBuffer(context);
  VVar3 = SubmitContext::getBuffer(context);
  uVar5 = 0xfffffffffffffffc;
  VVar4 = SubmitContext::getBufferSize(context);
  this->m_bufferSize = VVar4 & 0xfffffffffffffffc;
  (*pDVar1->_vptr_DeviceInterface[0x65])
            (pDVar1,pVVar2,VVar3.m_internal,0,this->m_bufferSize,(ulong)this->m_value,this,
             VVar3.m_internal,uVar5);
  return;
}

Assistant:

void FillBuffer::submit (SubmitContext& context)
{
	const vk::DeviceInterface&	vkd			= context.getContext().getDeviceInterface();
	const vk::VkCommandBuffer	cmd			= context.getCommandBuffer();
	const vk::VkBuffer			buffer		= context.getBuffer();
	const vk::VkDeviceSize		sizeMask	= ~(0x3ull); // \note Round down to multiple of 4

	m_bufferSize = sizeMask & context.getBufferSize();
	vkd.cmdFillBuffer(cmd, buffer, 0, m_bufferSize, m_value);
}